

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
VectorInstance::op_removeFirst_fromIndex
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  const_iterator __position;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined8 *puVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  it;
  int from_index;
  shared_ptr<Instance> instance;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_fffffffffffffed8;
  allocator *paVar5;
  shared_ptr<Instance> *in_stack_fffffffffffffee0;
  shared_ptr<Instance> *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  int iVar6;
  allocator local_d9;
  string *in_stack_ffffffffffffff28;
  IntegerInstance *in_stack_ffffffffffffff30;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  local_a8;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  IntegerInstance local_90;
  int local_2c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar3 != 2) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  get_shared_instance(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,1);
  IntegerInstance::IntegerInstance(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  iVar2 = IntegerInstance::value(&local_90);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1c1489);
  local_2c = iVar2;
  if ((iVar2 < 0) ||
     (iVar6 = iVar2,
     sVar3 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
             size((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                  (in_RSI + 0x78)), (int)sVar3 < iVar2)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
            (in_stack_fffffffffffffed8);
  local_a8 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
             ::operator+((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                          *)in_stack_fffffffffffffee8,(difference_type)in_stack_fffffffffffffee0);
  do {
    std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::end
              (in_stack_fffffffffffffed8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                        *)in_stack_fffffffffffffee0,
                       (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar1) {
LAB_001c15f1:
      paVar5 = &local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"null",paVar5);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c162d);
      return in_RDI;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
    ::operator*(&local_a8);
    in_stack_fffffffffffffef7 =
         InstanceIsEqualToComparator::operator()
                   ((InstanceIsEqualToComparator *)
                    CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                    in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    if ((bool)in_stack_fffffffffffffef7) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>const*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>
      ::__normal_iterator<std::shared_ptr<Instance>*>
                ((__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                  *)(in_RSI + 0x78),
                 (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                  *)in_stack_fffffffffffffed8);
      __position._M_current._4_4_ = iVar6;
      __position._M_current._0_4_ = iVar2;
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::erase
                ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),__position);
      goto LAB_001c15f1;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                  *)in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  } while( true );
}

Assistant:

std::string VectorInstance::op_removeFirst_fromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    int from_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    for (auto it = _value.begin() + from_index; it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance)) {
            _value.erase(it);
            break;
        }
    return "null";
}